

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Functional::MultiVertexArrayStorageTests::getTestName_abi_cxx11_
          (string *__return_storage_ptr__,MultiVertexArrayStorageTests *this,Spec *spec)

{
  int iVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference pvVar4;
  Storage storage;
  string local_1d8;
  int local_1b8;
  int arrayNdx;
  stringstream local_1a8 [8];
  stringstream name;
  ostream local_198;
  Spec *local_20;
  Spec *spec_local;
  MultiVertexArrayStorageTests *this_local;
  
  local_20 = spec;
  spec_local = (Spec *)this;
  this_local = (MultiVertexArrayStorageTests *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  sVar2 = std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::size(&local_20->arrays);
  std::ostream::operator<<(&local_198,sVar2);
  local_1b8 = 0;
  while( true ) {
    iVar1 = local_1b8;
    sVar2 = std::
            vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ::size(&local_20->arrays);
    if ((int)sVar2 <= iVar1) break;
    poVar3 = std::operator<<(&local_198,"_");
    pvVar4 = std::
             vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
             ::operator[](&local_20->arrays,(long)local_1b8);
    deqp::gls::Array::storageToString_abi_cxx11_(&local_1d8,(Array *)(ulong)pvVar4->storage,storage)
    ;
    std::operator<<(poVar3,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    local_1b8 = local_1b8 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string MultiVertexArrayStorageTests::getTestName (const MultiVertexArrayTest::Spec& spec)
{
	std::stringstream name;
	name
		<< spec.arrays.size();

	for (int arrayNdx = 0; arrayNdx < (int)spec.arrays.size(); arrayNdx++)
	{
		name
			<< "_"
			<< Array::storageToString(spec.arrays[arrayNdx].storage);
	}

	return name.str();
}